

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xr_sound_thumbnail.cxx
# Opt level: O0

void __thiscall xray_re::xr_sound_thumbnail::load(xr_sound_thumbnail *this,xr_reader *r)

{
  uint32_t uVar1;
  size_t sVar2;
  float fVar3;
  uint local_20;
  unsigned_short local_1a;
  uint32_t type;
  uint16_t version;
  xr_reader *r_local;
  xr_sound_thumbnail *this_local;
  
  _type = r;
  r_local = (xr_reader *)this;
  sVar2 = xr_reader::r_chunk<unsigned_short>(r,0x810,&local_1a);
  if (sVar2 == 0) {
    __assert_fail("0",
                  "/workspace/llm4binary/github/license_c_cmakelists/abramcumner[P]xray_re-tools/sources/xray_re/xr_sound_thumbnail.cxx"
                  ,0x10,"void xray_re::xr_sound_thumbnail::load(xr_reader &)");
  }
  if (local_1a != 0x14) {
    __assert_fail("version == THM_VERSION_SOUNDPARAM",
                  "/workspace/llm4binary/github/license_c_cmakelists/abramcumner[P]xray_re-tools/sources/xray_re/xr_sound_thumbnail.cxx"
                  ,0x11,"void xray_re::xr_sound_thumbnail::load(xr_reader &)");
  }
  sVar2 = xr_reader::r_chunk<unsigned_int>(_type,0x813,&local_20);
  if (sVar2 == 0) {
    __assert_fail("0",
                  "/workspace/llm4binary/github/license_c_cmakelists/abramcumner[P]xray_re-tools/sources/xray_re/xr_sound_thumbnail.cxx"
                  ,0x15,"void xray_re::xr_sound_thumbnail::load(xr_reader &)");
  }
  if (local_20 == 2) {
    sVar2 = xr_reader::find_chunk(_type,0x1000);
    if (sVar2 == 0) {
      __assert_fail("0",
                    "/workspace/llm4binary/github/license_c_cmakelists/abramcumner[P]xray_re-tools/sources/xray_re/xr_sound_thumbnail.cxx"
                    ,0x19,"void xray_re::xr_sound_thumbnail::load(xr_reader &)");
    }
    fVar3 = xr_reader::r_float(_type);
    this->quality = fVar3;
    fVar3 = xr_reader::r_float(_type);
    this->min_dist = fVar3;
    fVar3 = xr_reader::r_float(_type);
    this->max_dist = fVar3;
    uVar1 = xr_reader::r_u32(_type);
    this->game_type = uVar1;
    xr_reader::debug_find_chunk(_type);
    sVar2 = xr_reader::find_chunk(_type,0x1001);
    if (sVar2 != 0) {
      fVar3 = xr_reader::r_float(_type);
      this->base_volume = fVar3;
      xr_reader::debug_find_chunk(_type);
    }
    sVar2 = xr_reader::find_chunk(_type,0x1002);
    if (sVar2 != 0) {
      fVar3 = xr_reader::r_float(_type);
      this->max_ai_dist = fVar3;
      xr_reader::debug_find_chunk(_type);
    }
    return;
  }
  __assert_fail("type == THM_TYPE_SOUND",
                "/workspace/llm4binary/github/license_c_cmakelists/abramcumner[P]xray_re-tools/sources/xray_re/xr_sound_thumbnail.cxx"
                ,0x16,"void xray_re::xr_sound_thumbnail::load(xr_reader &)");
}

Assistant:

void xr_sound_thumbnail::load(xr_reader& r)
{
	uint16_t version;
	if (!r.r_chunk(THM_CHUNK_VERSION, version))
		xr_not_expected();
	xr_assert(version == THM_VERSION_SOUNDPARAM);

	uint32_t type;
	if (!r.r_chunk(THM_CHUNK_TYPE, type))
		xr_not_expected();
	xr_assert(type == THM_TYPE_SOUND);

	if (!r.find_chunk(THM_CHUNK_SOUNDPARAM))
		xr_not_expected();
	quality = r.r_float();
	min_dist = r.r_float();
	max_dist = r.r_float();
	game_type = r.r_u32();
	r.debug_find_chunk();

	if (r.find_chunk(THM_CHUNK_SOUNDPARAM_VOLUME)) {
		base_volume = r.r_float();
		r.debug_find_chunk();
	}
	if (r.find_chunk(THM_CHUNK_SOUNDPARAM_AI)) {
		max_ai_dist = r.r_float();
		r.debug_find_chunk();
	}
}